

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

int __thiscall
fmt::anon_unknown_1::PrecisionHandler::visit_any_int<bool>(PrecisionHandler *this,bool value)

{
  bool bVar1;
  CStringRef message;
  byte in_SIL;
  FormatError *in_stack_ffffffffffffffc8;
  BasicCStringRef<char> local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  bVar1 = IntChecker<false>::fits_in_int((bool)local_9);
  if (!bVar1) {
    message.data_ = (char *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef(&local_18,"number is too big");
    FormatError::FormatError(in_stack_ffffffffffffffc8,message);
    __cxa_throw(message.data_,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return (int)(local_9 & 1);
}

Assistant:

int visit_any_int(T value) {
    if (!IntChecker<std::numeric_limits<T>::is_signed>::fits_in_int(value))
      FMT_THROW(FormatError("number is too big"));
    return static_cast<int>(value);
  }